

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TypeSpecializeStElem(GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ObjectType OVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BailOutKind BVar8;
  IndirOpnd *pIVar9;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  undefined4 *puVar14;
  RegOpnd *pRVar15;
  BailOutKind BVar16;
  undefined4 uVar17;
  ValueType *this_00;
  Instr *this_01;
  char16_t *pcVar18;
  StackSym *sym;
  Instr **ppIVar19;
  int local_1b8 [2];
  char baseValueTypeStr [256];
  char16 debugStringBuffer [42];
  int local_54;
  char16_t *pcStack_50;
  int32 src1IntConstantValue;
  Instr **local_48;
  undefined4 local_3c;
  BailOutKind local_38;
  IRType local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pIVar9 = IR::Opnd::AsIndirOpnd((*pInstr)->m_dst);
  local_32[0] = (pIVar9->m_baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar2) ||
       ((bVar2 = DoTypedArrayTypeSpec(this), !bVar2 &&
        (bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), bVar2)))
       ) || ((bVar2 = DoNativeArrayTypeSpec(this), !bVar2 &&
             (bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), bVar2))))
     || ((bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), !bVar2
         && (bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), !bVar2)))) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
    if (bVar2) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar5,uVar6);
    if (!bVar2) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar10 = Func::GetJITFunctionBody(this->func);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar13 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
    pcVar18 = 
    L"typed array type specialization is disabled, or base is not an optimized typed array";
    if (bVar2) {
      pcVar18 = L"instruction uses the arguments object";
    }
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"
                  ,pcVar11,pcVar12,pcVar13,(char (*) [256])local_1b8,pcVar18);
    goto LAB_0043946c;
  }
  bVar2 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1);
  if ((!bVar2) &&
     ((src1Val == (Value *)0x0 ||
      (bVar2 = ValueInfo::HasIntConstantValue(src1Val->valueInfo,false), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2ae9,
                       "(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()))"
                       ,
                       "instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())"
                      );
    if (!bVar2) goto LAB_0043a047;
    *puVar14 = 0;
  }
  bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1);
  bVar2 = true;
  local_48 = pInstr;
  if (bVar3) {
    pRVar15 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
    sym = pRVar15->m_sym;
    if (sym == (StackSym *)0x0) goto LAB_004395c7;
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    bVar3 = GlobOptBlockData::IsInt32TypeSpecialized
                      (&this->currentBlock->globOptData,&sym->super_Sym);
    if (bVar2) {
      if (bVar3) goto LAB_00439729;
      if (src1Val != (Value *)0x0) {
        this_00 = &src1Val->valueInfo->super_ValueType;
        if ((this->field_0xf5 & 2) == 0) {
          bVar2 = ValueType::IsInt(this_00);
        }
        else {
          bVar2 = ValueType::IsLikelyInt(this_00);
        }
        if (bVar2 != false) goto LAB_00439729;
      }
      bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                        (&this->currentBlock->globOptData,&sym->super_Sym);
      if (!bVar2) {
        if (src1Val == (Value *)0x0) {
          return false;
        }
        bVar2 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
        if (!bVar2) {
          return false;
        }
      }
      bVar3 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      bVar2 = false;
      if (bVar3) {
        return false;
      }
      goto LAB_0043972b;
    }
    if ((bVar3) ||
       (bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                          (&this->currentBlock->globOptData,&sym->super_Sym), bVar2)) {
LAB_00439729:
      bVar2 = false;
      goto LAB_0043972b;
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
    if (bVar2) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Didn\'t specialize array access, because src is not type specialized.\n");
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar5,uVar6);
    if (!bVar2) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
    pJVar10 = Func::GetJITFunctionBody(this->func);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar13 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    pcVar18 = 
    L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"
    ;
  }
  else {
LAB_004395c7:
    sym = (StackSym *)0x0;
LAB_0043972b:
    bVar3 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0);
    if (((src1Val != (Value *)0x0 && bVar3) &&
        (bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,&local_54,false), bVar3)) &&
       (local_54 == -0x7fffe)) {
      return false;
    }
    ppIVar19 = local_48;
    bVar3 = IR::Opnd::IsIndirOpnd((*local_48)->m_dst);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2b2a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()"
                        );
      if (!bVar3) goto LAB_0043a047;
      *puVar14 = 0;
      ppIVar19 = local_48;
    }
    pIVar9 = IR::Opnd::AsIndirOpnd((*ppIVar19)->m_dst);
    BVar8 = BailOutIntOnly;
    ToVarUses(this,*ppIVar19,&pIVar9->super_Opnd,true,(Value *)0x0);
    bVar3 = ShouldExpectConventionalArrayIndexValue(this,pIVar9);
    if (bVar3) {
      OVar4 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
      uVar7 = OVar4 - 5;
      if (0x1a < uVar7) {
        bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2b8f,"(baseValueType.IsLikelyNativeArray())",
                             "baseValueType.IsLikelyNativeArray()");
          if (!bVar2) goto LAB_0043a047;
          *puVar14 = 0;
        }
        bVar2 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
        if (!bVar2) {
          bVar2 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
          BVar16 = BailOutConventionalNativeArrayAccessOnly;
          if (bVar2) {
            uVar17 = 0;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar14 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2b96,"(baseValueType.HasFloatElements())",
                               "baseValueType.HasFloatElements()");
            if (!bVar2) goto LAB_0043a047;
            *puVar14 = 0;
            uVar17 = 0;
            BVar16 = BailOutConventionalNativeArrayAccessOnly;
          }
          goto switchD_00439844_caseD_c;
        }
        BVar16 = BailOutConventionalNativeArrayAccessOnly;
        uVar17 = 0;
switchD_00439844_caseD_5:
        if ((this->field_0xf5 & 0x22) == 0) goto LAB_00439bbd;
        pcStack_50 = L"int32";
        local_33 = TyInt32;
        local_3c = uVar17;
        local_38 = BVar16;
LAB_00439d2c:
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
        if (bVar2) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"Type specialized array access.\n");
          IR::Instr::Dump(*local_48);
          Output::Flush();
        }
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar5,uVar6);
        if (bVar2) {
          ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
          pJVar10 = Func::GetJITFunctionBody(this->func);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
          pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
          pcVar13 = Js::OpCodeUtil::GetOpCodeName((*local_48)->m_opcode);
          Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"
                        ,pcVar11,pcVar12,pcVar13,local_1b8);
          Output::Flush();
        }
        ppIVar19 = local_48;
        ToTypeSpecUse(this,*local_48,(*local_48)->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0
                      ,local_33,BVar8,SUB41(local_3c,0),(Instr *)0x0);
        if (this->prePassLoop != (Loop *)0x0) {
          return true;
        }
        if (((*ppIVar19)->m_opcode == StElemC) &&
           (bVar2 = ValueType::IsObject((ValueType *)&local_32[0].field_0), bVar2)) {
          bVar2 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
          if (!bVar2) {
            return true;
          }
          local_1b8[0] = -0x80000000;
          baseValueTypeStr[0xf8] = -1;
          baseValueTypeStr[0xf9] = -1;
          baseValueTypeStr[0xfa] = -1;
          baseValueTypeStr[0xfb] = '\x7f';
          bVar2 = ValueInfo::GetIntValMinMax
                            (src1Val->valueInfo,local_1b8,(int *)(baseValueTypeStr + 0xf8),false);
          if (bVar2) {
            if (-0x7fffe < local_1b8[0]) {
              return true;
            }
            if ((int)baseValueTypeStr._248_4_ < -0x7fffe) {
              return true;
            }
          }
        }
        if (((*local_48)->field_0x38 & 0x10) == 0) {
          GenerateBailAtOperation(this,local_48,local_38);
          return true;
        }
        BVar8 = IR::Instr::GetBailOutKind(*local_48);
        if ((((BVar8 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
            ((BVar8 & ~BailOutKindBits) != BailOutInvalid)) ||
           ((BVar8 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                      BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                      BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                      BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                     BailOutOnResultConditions)) != BailOutInvalid)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2bcf,
                             "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                             ,
                             "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                            );
          if (!bVar2) goto LAB_0043a047;
          *puVar14 = 0;
        }
        if (local_38 != BailOutConventionalNativeArrayAccessOnly) {
          if (local_38 == BailOutConventionalTypedArrayAccessOnly) {
            this_01 = *local_48;
            BVar8 = BVar8 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                             BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                             BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                             BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                            BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
            goto LAB_0043a03a;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2bdc,
                             "(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                             "arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
          if (!bVar2) {
LAB_0043a047:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar14 = 0;
        }
        this_01 = *local_48;
        BVar8 = BVar8 | local_38;
LAB_0043a03a:
        IR::Instr::SetBailOutKind(this_01,BVar8);
        return true;
      }
      BVar16 = BailOutConventionalTypedArrayAccessOnly;
      uVar17 = (undefined4)CONCAT71((int7)((ulong)pIVar9 >> 8),1);
      switch((uint)OVar4) {
      default:
        goto switchD_00439844_caseD_5;
      case 7:
      case 0x10:
      case 0x19:
        local_33 = TyInt32;
        local_38 = BailOutConventionalTypedArrayAccessOnly;
        pcStack_50 = L"int32";
        if ((bVar2) ||
           (bVar2 = GlobOptBlockData::IsInt32TypeSpecialized
                              (&this->currentBlock->globOptData,&sym->super_Sym), bVar2)) {
          local_3c = 0;
        }
        else {
          bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                            (&this->currentBlock->globOptData,&sym->super_Sym);
          if (!bVar2) break;
          local_3c = 0xe31b01;
          uVar17 = local_3c;
          BVar16 = local_38;
LAB_00439d29:
          local_38 = BVar16;
          local_3c = uVar17;
          local_33 = TyFloat64;
          pcStack_50 = L"float64";
          BVar8 = BailOutNumberOnly;
        }
        goto LAB_00439d2c;
      case 0xb:
      case 0x14:
      case 0x1d:
        local_33 = TyInt32;
        local_3c = (undefined4)
                   CONCAT71((int7)((ulong)((long)&switchD_00439844::switchdataD_00e30a7c +
                                          (long)(int)(&switchD_00439844::switchdataD_00e30a7c)
                                                     [uVar7]) >> 8),1);
        local_38 = BailOutConventionalTypedArrayAccessOnly;
        pcStack_50 = L"int32";
        if ((bVar2) ||
           (bVar2 = GlobOptBlockData::IsInt32TypeSpecialized
                              (&this->currentBlock->globOptData,&sym->super_Sym), bVar2))
        goto LAB_00439d2c;
        bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                          (&this->currentBlock->globOptData,&sym->super_Sym);
        uVar17 = local_3c;
        BVar16 = local_38;
        if (bVar2) goto LAB_00439d29;
        break;
      case 0xc:
      case 0xd:
      case 0x15:
      case 0x16:
      case 0x1e:
      case 0x1f:
switchD_00439844_caseD_c:
        if ((this->field_0xf5 & 0x20) != 0) goto LAB_00439d29;
      }
LAB_00439bbd:
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
      ppIVar19 = local_48;
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(
                     L"Didn\'t specialize array access, because the source was not already specialized.\n"
                     );
        IR::Instr::Dump(*ppIVar19);
        Output::Flush();
      }
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar5,uVar6);
      if (!bVar2) {
        return false;
      }
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
      pJVar10 = Func::GetJITFunctionBody(this->func);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
      pcVar13 = Js::OpCodeUtil::GetOpCodeName((*ppIVar19)->m_opcode);
      pcVar18 = 
      L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"
      ;
    }
    else {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
      ppIVar19 = local_48;
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(
                     L"Didn\'t specialize array access, because index is negative or likely not int.\n"
                     );
        IR::Instr::Dump(*ppIVar19);
        Output::Flush();
      }
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar5,uVar6);
      if (!bVar2) {
        return false;
      }
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1b8);
      pJVar10 = Func::GetJITFunctionBody(this->func);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
      pcVar13 = Js::OpCodeUtil::GetOpCodeName((*ppIVar19)->m_opcode);
      pcVar18 = 
      L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"
      ;
    }
  }
  Output::Print(pcVar18,pcVar11,pcVar12,pcVar13,local_1b8);
LAB_0043946c:
  Output::Flush();
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeStElem(IR::Instr ** pInstr, Value *src1Val, Value **pDstVal)
{
    IR::Instr *&instr = *pInstr;

    IR::RegOpnd *baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    ValueType baseValueType(baseOpnd->GetValueType());
    if (instr->DoStackArgsOpt() ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !(baseValueType.IsLikelyOptimizedTypedArray() || baseValueType.IsLikelyNativeArray()))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                instr->DoStackArgsOpt() ?
                    _u("instruction uses the arguments object") :
                    _u("typed array type specialization is disabled, or base is not an optimized typed array"));
            Output::Flush();
        }
        return false;
    }

    Assert(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()));

    StackSym *sym = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd()->m_sym : nullptr;

    // Only type specialize the source of store element if the source symbol is already type specialized to int or float.
    if (sym)
    {
        if (baseValueType.IsLikelyNativeArray())
        {
            // Gently coerce these src's into native if it seems likely to work.
            // Otherwise we can't use the fast path to store.
            // But don't try to put a float-specialized number into an int array this way.
            if (!(
                    CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
                    (
                        src1Val &&
                        (
                            DoAggressiveIntTypeSpec()
                                ? src1Val->GetValueInfo()->IsLikelyInt()
                                : src1Val->GetValueInfo()->IsInt()
                        )
                    )
                ))
            {
                if (!(
                        CurrentBlockData()->IsFloat64TypeSpecialized(sym) ||
                        (src1Val && src1Val->GetValueInfo()->IsLikelyNumber())
                    ) ||
                    baseValueType.HasIntElements())
                {
                    return false;
                }
            }
        }
        else if (!CurrentBlockData()->IsInt32TypeSpecialized(sym) && !CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because src is not type specialized.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"),
                              this->func->GetJITFunctionBody()->GetDisplayName(),
                              this->func->GetDebugNumberSet(debugStringBuffer),
                              Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                              baseValueTypeStr);
                Output::Flush();
            }

            return false;
        }
    }

    int32 src1IntConstantValue;
    if(baseValueType.IsLikelyNativeIntArray() && src1Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue))
    {
        if(Js::SparseArraySegment<int32>::IsMissingItem(&src1IntConstantValue))
        {
            return false;
        }
    }

    // Note: doing ToVarUses to make sure we do get the int32 version of the index before trying to access its value in
    // ShouldExpectConventionalArrayIndexValue. Not sure why that never gave us a problem before.
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();

    // Make sure we use the int32 version of the index operand symbol, if available.  Otherwise, ensure the var symbol is live (by
    // potentially inserting a ToVar).
    this->ToVarUses(instr, dst, /* isDst = */ true, nullptr);

    if (!ShouldExpectConventionalArrayIndexValue(dst))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because index is negative or likely not int.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
        return false;
    }

    IRType          toType = TyVar;
    bool            isLossyAllowed = true;
    IR::BailOutKind arrayBailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Uint8Array:
    case ObjectType::Int16Array:
    case ObjectType::Uint16Array:
    case ObjectType::Int32Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int8MixedArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Int16MixedArray:
    case ObjectType::Uint16MixedArray:
    case ObjectType::Int32MixedArray:
    Int32Array:
        if (this->DoAggressiveIntTypeSpec() || this->DoFloatTypeSpec())
        {
            toType = TyInt32;
        }
        break;

    case ObjectType::Uint32Array:
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
        // Uint32Arrays may store values that overflow int32.  If the value being stored comes from a symbol that's
        // already losslessly type specialized to int32, we'll use it.  Otherwise, if we only have a float64 specialized
        // value, we don't want to force bailout if it doesn't fit in int32.  Instead, we'll emit conversion in the
        // lowerer, and handle overflow, if necessary.
        if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
        {
            toType = TyInt32;
        }
        else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            toType = TyFloat64;
        }
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float64Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
    if (this->DoFloatTypeSpec())
    {
         toType = TyFloat64;
    }
    break;

    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        // Uint8ClampedArray requires rounding (as opposed to truncation) of floating point values. If source symbol is
        // float type specialized, type specialize this instruction to float as well, and handle rounding in the
        // lowerer.
            if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
            {
                toType = TyInt32;
                isLossyAllowed = false;
            }
            else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
            {
                toType = TyFloat64;
            }
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        isLossyAllowed = false;
        arrayBailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if (toType != TyVar)
    {
        GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                toType == TyInt32 ? _u("int32") : _u("float64"));
            Output::Flush();
        }

        IR::BailOutKind bailOutKind = ((toType == TyInt32) ? IR::BailOutIntOnly : IR::BailOutNumberOnly);
        this->ToTypeSpecUse(instr, instr->GetSrc1(), this->currentBlock, src1Val, nullptr, toType, bailOutKind, /* lossy = */ isLossyAllowed);

        if (!this->IsLoopPrePass())
        {
            bool bConvertToBailoutInstr = true;
            // Definite StElemC doesn't need bailout, because it can't fail or cause conversion.
            if (instr->m_opcode == Js::OpCode::StElemC && baseValueType.IsObject())
            {
                if (baseValueType.HasIntElements())
                {
                    //Native int array requires a missing element check & bailout
                    int32 min = INT32_MIN;
                    int32 max = INT32_MAX;

                    if (src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, false))
                    {
                        bConvertToBailoutInstr = ((min <= Js::JavascriptNativeIntArray::MissingItem) && (max >= Js::JavascriptNativeIntArray::MissingItem));
                    }
                }
                else
                {
                    bConvertToBailoutInstr = false;
                }
            }

            if (bConvertToBailoutInstr)
            {
                if(instr->HasBailOutInfo())
                {
                    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                    Assert(
                        (
                            !(oldBailOutKind & ~IR::BailOutKindBits) ||
                            (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                        !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                    if(arrayBailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                    {
                        // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                        // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                        // bails out for the right reason.
                        instr->SetBailOutKind(
                            arrayBailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                    }
                    else
                    {
                        // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                        // calls to occur, so it must be merged in to eliminate generating the helper call.
                        Assert(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                        instr->SetBailOutKind(oldBailOutKind | arrayBailOutKind);
                    }
                }
                else
                {
                    GenerateBailAtOperation(&instr, arrayBailOutKind);
                }
            }
        }
    }
    else
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because the source was not already specialized.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
    }

    return toType != TyVar;
}